

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalCommonGenerator::GetTargetFortranFlags
          (string *__return_storage_ptr__,cmLocalCommonGenerator *this,cmGeneratorTarget *target,
          string *config)

{
  cmMakefile *pcVar1;
  string_view source;
  bool bVar2;
  string *psVar3;
  string *working_dir;
  ulong uVar4;
  string local_3a0;
  cmAlphaNum local_380;
  cmAlphaNum local_350;
  undefined1 local_320 [8];
  string flg;
  string *id;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_2d8;
  undefined1 local_2b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_298;
  cmValue local_278;
  cmValue modpath_flag;
  cmAlphaNum local_240;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  undefined1 local_1c8 [8];
  string incflag;
  allocator<char> local_171;
  string local_170;
  cmAlphaNum local_150;
  undefined1 local_120 [8];
  string modflag;
  string local_f8;
  string local_d8;
  string_view local_b8;
  string local_a8;
  undefined1 local_88 [8];
  string mod_dir;
  allocator<char> local_51;
  string local_50;
  byte local_29;
  string *local_28;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmLocalCommonGenerator *this_local;
  string *flags;
  
  local_29 = 0;
  local_28 = config;
  config_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  this_local = (cmLocalCommonGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_Fortran_MODOUT_FLAG",&local_51);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_50);
  (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(this,__return_storage_ptr__,psVar3);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  psVar3 = config_local;
  working_dir = GetWorkingDirectory_abi_cxx11_(this);
  cmGeneratorTarget::GetFortranModuleDirectory
            ((string *)local_88,(cmGeneratorTarget *)psVar3,working_dir);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    MaybeRelativeToWorkDir(&local_d8,this,(string *)local_88);
    local_b8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_d8);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_a8,&(this->super_cmLocalGenerator).super_cmOutputConverter,local_b8,SHELL);
    std::__cxx11::string::operator=((string *)local_88,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  else {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"CMAKE_Fortran_MODDIR_DEFAULT",
               (allocator<char> *)(modflag.field_2._M_local_buf + 0xf));
    psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_f8);
    std::__cxx11::string::operator=((string *)local_88,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)(modflag.field_2._M_local_buf + 0xf));
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"CMAKE_Fortran_MODDIR_FLAG",&local_171);
    psVar3 = cmMakefile::GetRequiredDefinition(pcVar1,&local_170);
    cmAlphaNum::cmAlphaNum(&local_150,psVar3);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&incflag.field_2 + 8),(string *)local_88);
    cmStrCat<>((string *)local_120,&local_150,(cmAlphaNum *)((long)&incflag.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
              (this,__return_storage_ptr__,local_120);
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"CMAKE_Fortran_MODDIR_INCLUDE_FLAG",&local_1e9);
    psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_1e8);
    std::__cxx11::string::string((string *)local_1c8,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      cmAlphaNum::cmAlphaNum(&local_240,(string *)local_1c8);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&modpath_flag,(string *)local_88);
      cmStrCat<>(&local_210,&local_240,(cmAlphaNum *)&modpath_flag);
      std::__cxx11::string::operator=((string *)local_1c8,(string *)&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
                (this,__return_storage_ptr__,(string *)local_1c8);
    }
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::~string((string *)local_120);
  }
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"CMAKE_Fortran_MODPATH_FLAG",
             (allocator<char> *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_278 = cmMakefile::GetDefinition(pcVar1,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_278);
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2b8);
    psVar3 = config_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"C",(allocator<char> *)((long)&__range2 + 7));
    cmLocalGenerator::GetIncludeDirectories
              (&this->super_cmLocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2b8,(cmGeneratorTarget *)psVar3,&local_2d8,local_28);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2b8);
    id = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2b8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&id);
      if (!bVar2) break;
      flg.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      psVar3 = cmValue::operator*[abi_cxx11_(&local_278);
      cmAlphaNum::cmAlphaNum(&local_350,psVar3);
      source = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)flg.field_2._8_8_)
      ;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_3a0,&(this->super_cmLocalGenerator).super_cmOutputConverter,source,SHELL);
      cmAlphaNum::cmAlphaNum(&local_380,&local_3a0);
      cmStrCat<>((string *)local_320,&local_350,&local_380);
      std::__cxx11::string::~string((string *)&local_3a0);
      (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
                (this,__return_storage_ptr__,local_320);
      std::__cxx11::string::~string((string *)local_320);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2b8);
  }
  local_29 = 1;
  std::__cxx11::string::~string((string *)local_88);
  if ((local_29 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalCommonGenerator::GetTargetFortranFlags(
  cmGeneratorTarget const* target, std::string const& config)
{
  std::string flags;

  // Enable module output if necessary.
  this->AppendFlags(
    flags, this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODOUT_FLAG"));

  // Add a module output directory flag if necessary.
  std::string mod_dir =
    target->GetFortranModuleDirectory(this->GetWorkingDirectory());
  if (!mod_dir.empty()) {
    mod_dir = this->ConvertToOutputFormat(
      this->MaybeRelativeToWorkDir(mod_dir), cmOutputConverter::SHELL);
  } else {
    mod_dir =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_DEFAULT");
  }
  if (!mod_dir.empty()) {
    std::string modflag = cmStrCat(
      this->Makefile->GetRequiredDefinition("CMAKE_Fortran_MODDIR_FLAG"),
      mod_dir);
    this->AppendFlags(flags, modflag);
    // Some compilers do not search their own module output directory
    // for using other modules.  Add an include directory explicitly
    // for consistency with compilers that do search it.
    std::string incflag =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_INCLUDE_FLAG");
    if (!incflag.empty()) {
      incflag = cmStrCat(incflag, mod_dir);
      this->AppendFlags(flags, incflag);
    }
  }

  // If there is a separate module path flag then duplicate the
  // include path with it.  This compiler does not search the include
  // path for modules.
  if (cmValue modpath_flag =
        this->Makefile->GetDefinition("CMAKE_Fortran_MODPATH_FLAG")) {
    std::vector<std::string> includes;
    this->GetIncludeDirectories(includes, target, "C", config);
    for (std::string const& id : includes) {
      std::string flg =
        cmStrCat(*modpath_flag,
                 this->ConvertToOutputFormat(id, cmOutputConverter::SHELL));
      this->AppendFlags(flags, flg);
    }
  }

  return flags;
}